

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::CheckFieldJsonNameUniqueness(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::DescriptorProto_const&,google::protobuf::Descriptor_const*,bool)::__1,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  size_t __n;
  size_t sVar1;
  int iVar2;
  long *plVar3;
  AlphaNum *in_R8;
  size_type in_R9;
  long lVar4;
  char *__s2;
  UntypedFormatSpecImpl format;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> args;
  string name_suffix;
  string_view existing_type;
  string_view this_type;
  undefined1 *local_150;
  undefined8 local_148;
  undefined1 local_140;
  undefined7 uStack_13f;
  ulong local_130;
  char *local_128;
  ulong local_120;
  char *local_118;
  string local_110;
  AlphaNum local_f0;
  AlphaNum local_c0;
  ulong *local_90;
  code *local_88;
  ulong local_80;
  code *local_78;
  long local_70;
  code *local_68;
  ulong *local_60;
  code *local_58;
  ulong local_50;
  code *local_48;
  undefined1 **local_40;
  code *local_38;
  
  lVar4 = *(long *)this;
  local_128 = "default";
  local_118 = "default";
  if ((ulong)*(byte *)(lVar4 + 0x28) != 0) {
    local_118 = "custom";
  }
  local_120 = (ulong)*(byte *)(lVar4 + 0x28) ^ 7;
  plVar3 = *(long **)(this + 8);
  if ((ulong)*(byte *)(plVar3 + 5) != 0) {
    local_128 = "custom";
  }
  local_130 = (ulong)*(byte *)(plVar3 + 5) ^ 7;
  local_150 = &local_140;
  local_148 = 0;
  local_140 = 0;
  __n = *(size_t *)(lVar4 + 0x10);
  sVar1 = plVar3[2];
  if (__n == sVar1) {
    if (__n == 0) goto LAB_0023272a;
    __s2 = (char *)plVar3[1];
    iVar2 = bcmp(*(void **)(lVar4 + 8),__s2,__n);
    if (iVar2 == 0) goto LAB_0023272a;
  }
  else {
    __s2 = (char *)plVar3[1];
  }
  local_90 = (ulong *)0x3;
  local_88 = (code *)0x41470c;
  local_f0.piece_._M_len = 2;
  local_f0.piece_._M_str = "\")";
  local_c0.piece_._M_len = sVar1;
  local_c0.piece_._M_str = __s2;
  StrCat_abi_cxx11_(&local_110,(lts_20250127 *)&local_90,&local_c0,&local_f0,in_R8);
  std::__cxx11::string::operator=((string *)&local_150,(string *)&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  lVar4 = *(long *)this;
  plVar3 = *(long **)(this + 8);
LAB_0023272a:
  local_80 = *(ulong *)(*(long *)(this + 0x10) + 0x18) & 0xfffffffffffffffc;
  local_50 = *(ulong *)(*plVar3 + 0x18) & 0xfffffffffffffffc;
  local_70 = lVar4 + 8;
  local_90 = &local_120;
  local_88 = str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  local_78 = str_format_internal::FormatArgImpl::Dispatch<std::__cxx11::string>;
  local_68 = str_format_internal::FormatArgImpl::Dispatch<std::__cxx11::string>;
  local_60 = &local_130;
  local_58 = str_format_internal::FormatArgImpl::
             Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  local_48 = str_format_internal::FormatArgImpl::Dispatch<std::__cxx11::string>;
  local_40 = &local_150;
  local_38 = str_format_internal::FormatArgImpl::Dispatch<std::__cxx11::string>;
  format.size_ = (size_t)&local_90;
  format.data_ = (void *)0x56;
  args.len_ = in_R9;
  args.ptr_ = (pointer)&DAT_00000006;
  str_format_internal::FormatPack_abi_cxx11_
            (__return_storage_ptr__,
             (str_format_internal *)
             "The %s JSON name of field \"%s\" (\"%s\") conflicts with the %s JSON name of field \"%s\"%s."
             ,format,args);
  if (local_150 != &local_140) {
    operator_delete(local_150,CONCAT71(uStack_13f,local_140) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}